

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O2

Var Js::Math::Hypot(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  double *pdVar7;
  uint uVar8;
  double dVar9;
  double value;
  int in_stack_00000010;
  Arguments local_50;
  undefined1 local_40 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x621,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00bd809a;
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_40,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  if ((local_40._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x622,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00bd809a;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x625,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00bd809a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar8 = local_40._0_4_ & 0xffffff;
  if (uVar8 == 3) {
    pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
    dVar9 = JavascriptConversion::ToNumber(pvVar6,pSVar1);
    pvVar6 = Arguments::operator[]((Arguments *)local_40,2);
    value = JavascriptConversion::ToNumber(pvVar6,pSVar1);
    bVar3 = JavascriptNumber::IsPosInf(dVar9);
    if (bVar3) goto LAB_00bd8027;
    bVar3 = JavascriptNumber::IsNegInf(dVar9);
    if (bVar3) goto LAB_00bd8027;
    bVar3 = JavascriptNumber::IsPosInf(value);
    if (bVar3) goto LAB_00bd8027;
    bVar3 = JavascriptNumber::IsNegInf(value);
    if (bVar3) goto LAB_00bd8027;
    BVar4 = JavascriptNumber::IsNan(dVar9);
    if (BVar4 == 0) {
      BVar4 = JavascriptNumber::IsNan(value);
      if (BVar4 == 0) {
        dVar9 = hypot(dVar9,value);
        goto LAB_00bd8053;
      }
    }
    pdVar7 = &NumberConstants::NaN;
  }
  else {
    if (uVar8 != 2) {
      dVar9 = 0.0;
      if (3 < uVar8) {
        local_50.Values = (Type)args.super_Arguments.Info;
        dVar9 = HypotHelper(&local_50,pSVar1);
      }
      goto LAB_00bd8053;
    }
    pvVar6 = Arguments::operator[]((Arguments *)local_40,1);
    dVar9 = JavascriptConversion::ToNumber(pvVar6,pSVar1);
    bVar3 = JavascriptNumber::IsPosInf(dVar9);
    if (!bVar3) {
      bVar3 = JavascriptNumber::IsNegInf(dVar9);
      if (!bVar3) {
        dVar9 = Abs(dVar9);
        goto LAB_00bd8053;
      }
    }
LAB_00bd8027:
    pdVar7 = &NumberConstants::POSITIVE_INFINITY;
  }
  dVar9 = *pdVar7;
LAB_00bd8053:
  pvVar6 = JavascriptNumber::ToVarNoCheck(dVar9,pSVar1);
  return pvVar6;
}

Assistant:

Var Math::Hypot(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Math_Constructor_hypot);

        // ES6 20.2.2.18 Math.hypot(value1, value2, ...values)
        // If no arguments are passed, the result is +0.
        // If any argument is +Infinity, the result is +Infinity.
        // If any argument is -Infinity, the result is +Infinity.
        // If no argument is +Infinity or -Infinity, and any argument is NaN, the result is NaN.
        // If all arguments are either +0 or -0, the result is +0.

        double result = JavascriptNumber::k_Zero; // If there are no arguments return value is positive zero.

        if (args.Info.Count == 2)
        {
            // Special case for one argument
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else
            {
                result = Math::Abs(x1);
            }
        }
        else if (args.Info.Count == 3)
        {
            // CRT hypot call
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);
            double x2 = JavascriptConversion::ToNumber(args[2], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1) ||
                JavascriptNumber::IsPosInf(x2) || JavascriptNumber::IsNegInf(x2))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else if (JavascriptNumber::IsNan(x1) || JavascriptNumber::IsNan(x2))
            {
                result = JavascriptNumber::NaN;
            }
            else
            {
                result = ::hypot(x1, x2);
            }
        }
        else if (args.Info.Count > 3)
        {
            // Uncommon case of more than 2 arguments for hypot
            result = Math::HypotHelper(args, scriptContext);
        }

        return JavascriptNumber::ToVarNoCheck(result, scriptContext);
    }